

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O2

exr_result_t
exr_attr_set_string_vector(exr_context_t ctxt,int part_index,char *name,int32_t size,char **val)

{
  pthread_mutex_t *__mutex;
  exr_result_t eVar1;
  int iVar2;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  size_t sVar3;
  long lVar4;
  exr_attribute_list_t *peVar5;
  char *pcVar6;
  exr_context_t nonc;
  int32_t i;
  ulong uVar7;
  exr_result_t eStackY_60;
  exr_attribute_t *attr;
  exr_attribute_list_t *local_48;
  exr_attribute_list_t *local_40;
  long local_38;
  
  attr = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  __mutex = &ctxt->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar1 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar1;
  }
  if (ctxt->mode == '\x03') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eStackY_60 = 0x15;
  }
  else {
    if (ctxt->mode != '\0') {
      if (size < 0) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        eVar1 = (*ctxt->print_error)
                          (ctxt,3,"Invalid size (%d) for string vector \'%s\'",(ulong)(uint)size,
                           name,ctxt->print_error);
        return eVar1;
      }
      if (val == (char **)0x0) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        eVar1 = (*ctxt->print_error)
                          (ctxt,3,"No input string values for setting \'%s\', type \'stringvector\'"
                           ,name,ctxt->print_error);
        return eVar1;
      }
      local_48 = &ctxt->parts[(uint)part_index]->attributes;
      iVar2 = exr_attr_list_find_by_name(ctxt,local_48,name,&attr);
      if (iVar2 == 0) {
        if (attr->type != EXR_ATTR_STRING_VECTOR) {
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          eVar1 = (*ctxt->print_error)
                            (ctxt,0x10,
                             "\'%s\' requested type \'stringvector\', but attribute is type \'%s\'",
                             name,attr->type_name);
          return eVar1;
        }
        if (((((attr->field_6).box2i)->min).x == size) && (0 < (((attr->field_6).box2i)->min).y)) {
          if (ctxt->mode == '\x01') {
            iVar2 = 0;
            for (peVar5 = (exr_attribute_list_t *)0x0;
                (iVar2 == 0 && (peVar5 < (exr_attribute_list_t *)(ulong)(uint)size));
                peVar5 = (exr_attribute_list_t *)((long)&peVar5->num_attributes + 1)) {
              iVar2 = exr_attr_string_vector_set_entry
                                (ctxt,(attr->field_6).stringvector,(int32_t)peVar5,val[(long)peVar5]
                                );
            }
          }
          else {
            lVar4 = 0;
            iVar2 = 0;
            local_40 = (exr_attribute_list_t *)(ulong)(uint)size;
            for (peVar5 = (exr_attribute_list_t *)0x0; (iVar2 == 0 && (peVar5 < local_40));
                peVar5 = (exr_attribute_list_t *)((long)&peVar5->num_attributes + 1)) {
              pcVar6 = val[(long)peVar5];
              if (pcVar6 == (char *)0x0) {
                pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                eVar1 = (*ctxt->print_error)
                                  (ctxt,3,"\'%s\' received NULL string in string vector",name);
                return eVar1;
              }
              local_48 = peVar5;
              sVar3 = strlen(pcVar6);
              peVar5 = local_48;
              if (sVar3 != (long)*(int *)((long)&((attr->field_6).stringvector)->strings->length +
                                         lVar4)) {
                pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                uVar7 = (ulong)*(uint *)(((attr->field_6).chlist)->entries->reserved + lVar4 + -0x15
                                        );
                pcVar6 = 
                "\'%s\' string %d in string vector is different size (old %d new %d), unable to update"
                ;
                eVar1 = 3;
                peVar5 = local_48;
                goto LAB_0011d6f9;
              }
              local_38 = lVar4;
              iVar2 = exr_attr_string_vector_set_entry_with_length
                                (ctxt,(attr->field_6).stringvector,(int32_t)local_48,pcVar6,
                                 (int32_t)sVar3);
              lVar4 = local_38 + 0x10;
            }
          }
        }
        else {
          if (ctxt->mode != '\x01') {
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
            peVar5 = (exr_attribute_list_t *)(ulong)((attr->field_6).preview)->width;
            pcVar6 = "Existing string vector \'%s\' has %d strings, but given %d, unable to change";
            eVar1 = 0x14;
            uVar7 = (ulong)(uint)size;
LAB_0011d6f9:
            eVar1 = (*ctxt->print_error)(ctxt,eVar1,pcVar6,name,peVar5,uVar7);
            return eVar1;
          }
          iVar2 = 0;
          for (uVar7 = 0; (iVar2 == 0 && (uVar7 < (uint)size)); uVar7 = uVar7 + 1) {
            iVar2 = exr_attr_string_vector_set_entry
                              (ctxt,(attr->field_6).stringvector,(int32_t)uVar7,val[uVar7]);
          }
        }
      }
      else if (iVar2 == 0xf) {
        if (ctxt->mode != '\x01') {
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          return 0xf;
        }
        iVar2 = exr_attr_list_add(ctxt,local_48,name,EXR_ATTR_STRING_VECTOR,0,(uint8_t **)0x0,&attr)
        ;
        if (iVar2 == 0) {
          iVar2 = exr_attr_string_vector_init(ctxt,(attr->field_6).stringvector,size);
        }
        for (uVar7 = 0; (iVar2 == 0 && (uVar7 < (uint)size)); uVar7 = uVar7 + 1) {
          iVar2 = exr_attr_string_vector_set_entry
                            (ctxt,(attr->field_6).stringvector,(int32_t)uVar7,val[uVar7]);
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return iVar2;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eStackY_60 = 8;
  }
  eVar1 = (*UNRECOVERED_JUMPTABLE)(ctxt,eStackY_60);
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_set_string_vector (
    exr_context_t ctxt,
    int           part_index,
    const char*   name,
    int32_t       size,
    const char**  val)
{
    exr_attribute_t* attr = NULL;
    exr_result_t     rv   = EXR_ERR_SUCCESS;

    EXR_LOCK_AND_DEFINE_PART (part_index);

    if (ctxt->mode == EXR_CONTEXT_READ)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE));
    if (ctxt->mode == EXR_CONTEXT_WRITING_DATA)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_ALREADY_WROTE_ATTRS));

    if (size < 0)
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid size (%d) for string vector '%s'",
            size,
            name));

    if (!val)
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "No input string values for setting '%s', type 'stringvector'",
            name));

    rv = exr_attr_list_find_by_name (
        ctxt, (exr_attribute_list_t*) &(part->attributes), name, &attr);

    if (rv == EXR_ERR_NO_ATTR_BY_NAME)
    {
        if (ctxt->mode != EXR_CONTEXT_WRITE) return EXR_UNLOCK_AND_RETURN (rv);

        rv = exr_attr_list_add (
            ctxt,
            &(part->attributes),
            name,
            EXR_ATTR_STRING_VECTOR,
            0,
            NULL,
            &(attr));
        if (rv == EXR_ERR_SUCCESS)
            rv = exr_attr_string_vector_init (ctxt, attr->stringvector, size);
        for (int32_t i = 0; rv == EXR_ERR_SUCCESS && i < size; ++i)
            rv = exr_attr_string_vector_set_entry (
                ctxt, attr->stringvector, i, val[i]);
    }
    else if (rv == EXR_ERR_SUCCESS)
    {
        if (attr->type != EXR_ATTR_STRING_VECTOR)
            return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_ATTR_TYPE_MISMATCH,
                "'%s' requested type 'stringvector', but attribute is type '%s'",
                name,
                attr->type_name));
        if (attr->stringvector->n_strings == size &&
            attr->stringvector->alloc_size > 0)
        {
            if (ctxt->mode != EXR_CONTEXT_WRITE)
            {
                for (int32_t i = 0; rv == EXR_ERR_SUCCESS && i < size; ++i)
                {
                    size_t curlen;
                    if (!val[i])
                        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                            ctxt,
                            EXR_ERR_INVALID_ARGUMENT,
                            "'%s' received NULL string in string vector",
                            name));

                    curlen = strlen (val[i]);
                    if (curlen !=
                        (size_t) attr->stringvector->strings[i].length)
                        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                            ctxt,
                            EXR_ERR_INVALID_ARGUMENT,
                            "'%s' string %d in string vector is different size (old %d new %d), unable to update",
                            name,
                            i,
                            attr->stringvector->strings[i].length,
                            (int32_t) curlen));

                    rv = exr_attr_string_vector_set_entry_with_length (
                        ctxt, attr->stringvector, i, val[i], (int32_t) curlen);
                }
            }
            else
            {
                for (int32_t i = 0; rv == EXR_ERR_SUCCESS && i < size; ++i)
                    rv = exr_attr_string_vector_set_entry (
                        ctxt, attr->stringvector, i, val[i]);
            }
        }
        else if (ctxt->mode != EXR_CONTEXT_WRITE)
        {
            return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_MODIFY_SIZE_CHANGE,
                "Existing string vector '%s' has %d strings, but given %d, unable to change",
                name,
                attr->stringvector->n_strings,
                size));
        }
        else
        {
            for (int32_t i = 0; rv == EXR_ERR_SUCCESS && i < size; ++i)
                rv = exr_attr_string_vector_set_entry (
                    ctxt, attr->stringvector, i, val[i]);
        }
    }
    return EXR_UNLOCK_AND_RETURN (rv);
}